

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void pass2_no_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  _func_void_j_decompress_ptr *p_Var2;
  JSAMPROW pJVar3;
  uint c2;
  byte *pbVar4;
  long lVar5;
  short sVar6;
  long lVar7;
  ulong local_58;
  
  if (0 < num_rows) {
    p_Var2 = cinfo->cquantize[1].finish_pass;
    JVar1 = cinfo->output_width;
    local_58 = 0;
    do {
      if (JVar1 != 0) {
        pJVar3 = output_buf[local_58];
        pbVar4 = input_buf[local_58];
        lVar7 = 0;
        do {
          c2 = (uint)(pbVar4[2] >> 3);
          lVar5 = (ulong)(pbVar4[1] >> 2) * 0x40 + *(long *)(p_Var2 + (*pbVar4 & 0xfffffff8));
          sVar6 = *(short *)(lVar5 + (ulong)c2 * 2);
          if (sVar6 == 0) {
            fill_inverse_cmap(cinfo,(uint)(*pbVar4 >> 3),(uint)(pbVar4[1] >> 2),c2);
            sVar6 = *(short *)(lVar5 + (ulong)c2 * 2);
          }
          pJVar3[lVar7] = (char)sVar6 + 0xff;
          lVar7 = lVar7 + 1;
          pbVar4 = pbVar4 + 3;
        } while (JVar1 != (JDIMENSION)lVar7);
      }
      local_58 = local_58 + 1;
    } while (local_58 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
pass2_no_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPARRAY output_buf, int num_rows)
/* This version performs no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  register JSAMPROW inptr, outptr;
  register histptr cachep;
  register int c0, c1, c2;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    inptr = input_buf[row];
    outptr = output_buf[row];
    for (col = width; col > 0; col--) {
      /* get pixel value and index into the cache */
      c0 = (*inptr++) >> C0_SHIFT;
      c1 = (*inptr++) >> C1_SHIFT;
      c2 = (*inptr++) >> C2_SHIFT;
      cachep = &histogram[c0][c1][c2];
      /* If we have not seen this color before, find nearest colormap entry */
      /* and update the cache */
      if (*cachep == 0)
        fill_inverse_cmap(cinfo, c0, c1, c2);
      /* Now emit the colormap index for this cell */
      *outptr++ = (JSAMPLE)(*cachep - 1);
    }
  }
}